

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stmt.cc
# Opt level: O0

unordered_set<std::shared_ptr<kratos::AssignStmt>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
* kratos::filter_assignments_with_target
            (unordered_set<std::shared_ptr<kratos::AssignStmt>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
             *__return_storage_ptr__,
            unordered_set<std::shared_ptr<kratos::AssignStmt>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
            *stmts,Generator *target,bool lhs)

{
  bool bVar1;
  int iVar2;
  __shared_ptr_access<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this;
  element_type *peVar3;
  Var **ppVVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  value_type *stmt;
  const_iterator __end1;
  const_iterator __begin1;
  unordered_set<std::shared_ptr<kratos::AssignStmt>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
  *__range1;
  bool lhs_local;
  Generator *target_local;
  unordered_set<std::shared_ptr<kratos::AssignStmt>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
  *stmts_local;
  unordered_set<std::shared_ptr<kratos::AssignStmt>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
  *result;
  
  std::
  unordered_set<std::shared_ptr<kratos::AssignStmt>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
  ::unordered_set(__return_storage_ptr__);
  __end1 = std::
           unordered_set<std::shared_ptr<kratos::AssignStmt>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
           ::begin(stmts);
  stmt = (value_type *)
         std::
         unordered_set<std::shared_ptr<kratos::AssignStmt>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
         ::end(stmts);
  while (bVar1 = std::__detail::operator!=
                           (&__end1.
                             super__Node_iterator_base<std::shared_ptr<kratos::AssignStmt>,_false>,
                            (_Node_iterator_base<std::shared_ptr<kratos::AssignStmt>,_false> *)&stmt
                           ), bVar1) {
    this = (__shared_ptr_access<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
           std::__detail::_Node_const_iterator<std::shared_ptr<kratos::AssignStmt>,_true,_false>::
           operator*(&__end1);
    if (lhs) {
      peVar3 = std::
               __shared_ptr_access<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->(this);
      ppVVar4 = AssignStmt::left(peVar3);
      iVar2 = (*((*ppVVar4)->super_IRNode)._vptr_IRNode[0xd])();
      if ((Generator *)CONCAT44(extraout_var,iVar2) == target) {
        std::
        unordered_set<std::shared_ptr<kratos::AssignStmt>,std::hash<std::shared_ptr<kratos::AssignStmt>>,std::equal_to<std::shared_ptr<kratos::AssignStmt>>,std::allocator<std::shared_ptr<kratos::AssignStmt>>>
        ::emplace<std::shared_ptr<kratos::AssignStmt>const&>
                  ((unordered_set<std::shared_ptr<kratos::AssignStmt>,std::hash<std::shared_ptr<kratos::AssignStmt>>,std::equal_to<std::shared_ptr<kratos::AssignStmt>>,std::allocator<std::shared_ptr<kratos::AssignStmt>>>
                    *)__return_storage_ptr__,(shared_ptr<kratos::AssignStmt> *)this);
      }
    }
    else {
      peVar3 = std::
               __shared_ptr_access<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->(this);
      ppVVar4 = AssignStmt::right(peVar3);
      iVar2 = (*((*ppVVar4)->super_IRNode)._vptr_IRNode[0xd])();
      if ((Generator *)CONCAT44(extraout_var_00,iVar2) == target) {
        std::
        unordered_set<std::shared_ptr<kratos::AssignStmt>,std::hash<std::shared_ptr<kratos::AssignStmt>>,std::equal_to<std::shared_ptr<kratos::AssignStmt>>,std::allocator<std::shared_ptr<kratos::AssignStmt>>>
        ::emplace<std::shared_ptr<kratos::AssignStmt>const&>
                  ((unordered_set<std::shared_ptr<kratos::AssignStmt>,std::hash<std::shared_ptr<kratos::AssignStmt>>,std::equal_to<std::shared_ptr<kratos::AssignStmt>>,std::allocator<std::shared_ptr<kratos::AssignStmt>>>
                    *)__return_storage_ptr__,(shared_ptr<kratos::AssignStmt> *)this);
      }
    }
    std::__detail::_Node_const_iterator<std::shared_ptr<kratos::AssignStmt>,_true,_false>::
    operator++(&__end1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::unordered_set<std::shared_ptr<AssignStmt>> filter_assignments_with_target(
    const std::unordered_set<std::shared_ptr<AssignStmt>> &stmts, const Generator *target,
    bool lhs) {
    std::unordered_set<std::shared_ptr<AssignStmt>> result;
    for (const auto &stmt : stmts) {
        if (lhs) {
            if (stmt->left()->generator() == target) result.emplace(stmt);
        } else {
            if (stmt->right()->generator() == target) result.emplace(stmt);
        }
    }
    return result;
}